

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcBuildWithModuleName(char *code,char *moduleName)

{
  nullres nVar1;
  int iVar2;
  uint uVar3;
  CompilerStatistics *pCVar4;
  char *local_50;
  char *bytecode;
  undefined1 local_40 [4];
  uint start;
  TraceScope traceScope;
  char *moduleName_local;
  char *code_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    code_local._7_1_ = '\0';
  }
  else {
    if (nullcBuildWithModuleName::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcBuildWithModuleName::token);
      if (iVar2 != 0) {
        nullcBuildWithModuleName::token = NULLC::TraceGetToken("nullc","nullcBuild");
        __cxa_guard_release(&nullcBuildWithModuleName::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcBuildWithModuleName::token);
    bytecode._4_4_ = NULLCTime::clockMicro();
    nVar1 = nullcCompile(code);
    if (nVar1 == '\0') {
      code_local._7_1_ = '\0';
    }
    else {
      pCVar4 = (CompilerStatistics *)(NULLC::compilerCtx + 0xa5b0);
      uVar3 = NULLCTime::clockMicro();
      CompilerStatistics::Start(pCVar4,uVar3);
      local_50 = (char *)0x0;
      nullcGetBytecode(&local_50);
      pCVar4 = (CompilerStatistics *)(NULLC::compilerCtx + 0xa5b0);
      uVar3 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(pCVar4,"Bytecode",uVar3);
      if ((*(byte *)(NULLC::compilerCtx + 0xa5a8) & 1) != 0) {
        pCVar4 = (CompilerStatistics *)(NULLC::compilerCtx + 0xa5b0);
        uVar3 = NULLCTime::clockMicro();
        OutputCompilerStatistics(pCVar4,uVar3 - bytecode._4_4_);
      }
      nullcClean();
      nVar1 = nullcLinkCodeWithModuleName(local_50,moduleName);
      if (nVar1 == '\0') {
        if (local_50 != (char *)0x0) {
          operator_delete__(local_50);
        }
        code_local._7_1_ = '\0';
      }
      else {
        if (local_50 != (char *)0x0) {
          operator_delete__(local_50);
        }
        code_local._7_1_ = '\x01';
      }
    }
    bytecode._0_4_ = 1;
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  return code_local._7_1_;
}

Assistant:

nullres nullcBuildWithModuleName(const char* code, const char* moduleName)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcBuild");

	using namespace NULLC;

	unsigned start = NULLCTime::clockMicro();

	if(!nullcCompile(code))
		return false;

	compilerCtx->statistics.Start(NULLCTime::clockMicro());

	char *bytecode = NULL;
	nullcGetBytecode(&bytecode);

	compilerCtx->statistics.Finish("Bytecode", NULLCTime::clockMicro());

	if(compilerCtx->enableLogFiles)
	{
		OutputCompilerStatistics(compilerCtx->statistics, NULLCTime::clockMicro() - start);
	}

	nullcClean();

	if(!nullcLinkCodeWithModuleName(bytecode, moduleName))
	{
		delete[] bytecode;
		return false;
	}

	delete[] bytecode;
	return true;
}